

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_holylight(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *txt;
  
  bVar1 = is_npc(ch);
  if (bVar1) {
    return;
  }
  txt = "Holy light mode off.\n\r";
  if (((uint)ch->act[0] >> 0xd & 1) == 0) {
    txt = "Holy light mode on.\n\r";
  }
  ch->act[0] = ch->act[0] ^ 0x2000;
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_holylight(CHAR_DATA *ch, char *argument)
{
	if (is_npc(ch))
		return;

	if (IS_SET(ch->act, PLR_HOLYLIGHT))
	{
		REMOVE_BIT(ch->act, PLR_HOLYLIGHT);
		send_to_char("Holy light mode off.\n\r", ch);
	}
	else
	{
		SET_BIT(ch->act, PLR_HOLYLIGHT);
		send_to_char("Holy light mode on.\n\r", ch);
	}
}